

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c
# Opt level: O1

sexp_conflict
sexp_rename_file_stub
          (sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg0,sexp_conflict arg1)

{
  int iVar1;
  sexp_conflict psVar2;
  
  if ((((ulong)arg0 & 3) != 0) || (arg0->tag != 9)) {
    psVar2 = (sexp_conflict)sexp_type_exception(ctx,self,9);
    return psVar2;
  }
  if ((((ulong)arg1 & 3) == 0) && (arg1->tag == 9)) {
    iVar1 = rename((((arg0->value).type.cpl)->value).flonum_bits +
                   (long)(((arg0->value).type.name)->value).flonum_bits,
                   (((arg1->value).type.cpl)->value).flonum_bits +
                   (long)(((arg1->value).type.name)->value).flonum_bits);
    return (sexp_conflict)((ulong)(iVar1 == 0) << 8 | 0x3e);
  }
  psVar2 = (sexp_conflict)sexp_type_exception(ctx,self,9,arg1);
  return psVar2;
}

Assistant:

sexp sexp_rename_file_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg0, sexp arg1) {
  int err = 0;
  sexp res;
  if (! sexp_stringp(arg0))
    return sexp_type_exception(ctx, self, SEXP_STRING, arg0);
  if (! sexp_stringp(arg1))
    return sexp_type_exception(ctx, self, SEXP_STRING, arg1);
  err = rename(sexp_string_data(arg0), sexp_string_data(arg1));
  if (err) {
  res = SEXP_FALSE;
  } else {
  res = SEXP_TRUE;
  }
  return res;
}